

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

void runImagePair(void)

{
  allocator<char> local_e9;
  allocator<char> local_e8 [32];
  Mat img2;
  Mat img1;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&img2,"../data/nn_left.jpg",local_e8)
  ;
  cv::imread((string *)&img1,(int)&img2);
  std::__cxx11::string::~string((string *)&img2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"../data/nn_right.jpg",&local_e9);
  cv::imread((string *)&img2,(int)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  imresize(&img1,0x1e0);
  imresize(&img2,0x1e0);
  GmsMatch(&img1,&img2);
  cv::Mat::~Mat(&img2);
  cv::Mat::~Mat(&img1);
  return;
}

Assistant:

void runImagePair(){
	Mat img1 = imread("../data/nn_left.jpg");
	Mat img2 = imread("../data/nn_right.jpg");

	imresize(img1, 480);
	imresize(img2, 480);

	GmsMatch(img1, img2);
}